

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.pb.h
# Opt level: O2

FeatureVectorizer * __thiscall CoreML::Specification::Model::mutable_featurevectorizer(Model *this)

{
  FeatureVectorizer *this_00;
  
  if (this->_oneof_case_[0] == 0x25a) {
    this_00 = (FeatureVectorizer *)(this->Type_).pipelineclassifier_;
  }
  else {
    clear_Type(this);
    this->_oneof_case_[0] = 0x25a;
    this_00 = (FeatureVectorizer *)operator_new(0x30);
    FeatureVectorizer::FeatureVectorizer(this_00);
    (this->Type_).featurevectorizer_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::FeatureVectorizer* Model::mutable_featurevectorizer() {
  if (!has_featurevectorizer()) {
    clear_Type();
    set_has_featurevectorizer();
    Type_.featurevectorizer_ = new ::CoreML::Specification::FeatureVectorizer;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.Model.featureVectorizer)
  return Type_.featurevectorizer_;
}